

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

string * __thiscall
deqp::gls::ShaderExecUtil::generateVertexShaderForTess_abi_cxx11_
          (string *__return_storage_ptr__,ShaderExecUtil *this,GLSLVersion version)

{
  char *pcVar1;
  ostream *poVar2;
  undefined1 local_190 [8];
  ostringstream src;
  GLSLVersion version_local;
  
  src._372_4_ = SUB84(this,0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  pcVar1 = glu::getGLSLVersionDeclaration(src._372_4_);
  poVar2 = std::operator<<((ostream *)local_190,pcVar1);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)local_190,"void main (void)\n{\n");
  poVar2 = std::operator<<(poVar2,"\tgl_Position = vec4(gl_VertexID/2, gl_VertexID%2, 0.0, 1.0);\n")
  ;
  std::operator<<(poVar2,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

static std::string generateVertexShaderForTess (glu::GLSLVersion version)
{
	std::ostringstream	src;

	src << glu::getGLSLVersionDeclaration(version) << "\n";

	src << "void main (void)\n{\n"
		<< "	gl_Position = vec4(gl_VertexID/2, gl_VertexID%2, 0.0, 1.0);\n"
		<< "}\n";

	return src.str();
}